

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_gen_image_color(rf_image *__return_storage_ptr__,int width,int height,rf_color color,
                  rf_allocator allocator)

{
  rf_source_location rVar1;
  undefined1 auVar2 [24];
  void *pvVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uStack_54;
  rf_allocator allocator_local;
  
  allocator_local.allocator_proc = allocator.allocator_proc;
  allocator_local.user_data = allocator.user_data;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  uVar5 = height * width;
  rVar1.proc_name = "rf_gen_image_color";
  rVar1.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar1.line_in_file = 0x4186;
  auVar2._8_8_ = (ulong)uStack_54 << 0x20;
  auVar2._0_8_ = (long)(int)(uVar5 * 4);
  auVar2._16_8_ = 0;
  pvVar3 = (*allocator_local.allocator_proc)
                     (&allocator_local,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar2 << 0x40));
  if (pvVar3 != (void *)0x0) {
    uVar4 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar4;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      *(rf_color *)((long)pvVar3 + uVar4 * 4) = color;
    }
    __return_storage_ptr__->data = pvVar3;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_color(int width, int height, rf_color color, rf_allocator allocator)
{
    rf_image result = {0};

    int dst_size = width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
    void* dst = RF_ALLOC(allocator, dst_size);

    if (dst)
    {
        result = rf_gen_image_color_to_buffer(width, height, color, dst, width * height);
    }

    return result;
}